

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void js_array_mark(JSRuntime *rt,JSValue val,JS_MarkFunc *mark_func)

{
  JSValue val_00;
  int64_t in_RCX;
  JSValueUnion in_RSI;
  int i;
  JSObject *p;
  JS_MarkFunc *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar1;
  
  for (uVar1 = 0; uVar1 < *(uint *)((long)in_RSI.ptr + 0x40); uVar1 = uVar1 + 1) {
    val_00.tag = in_RCX;
    val_00.u.ptr = in_RSI.ptr;
    JS_MarkValue((JSRuntime *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),val_00,
                 in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

static void js_array_mark(JSRuntime *rt, JSValueConst val,
                          JS_MarkFunc *mark_func)
{
    JSObject *p = JS_VALUE_GET_OBJ(val);
    int i;

    for(i = 0; i < p->u.array.count; i++) {
        JS_MarkValue(rt, p->u.array.u.values[i], mark_func);
    }
}